

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int buffer_insert_pages(bfy_buffer *buf,size_t pos,bfy_page *new_pages,size_t new_len)

{
  bfy_page **ppbVar1;
  bfy_buffer *pbVar2;
  int8_t *piVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  bfy_unref_cb *pbVar7;
  undefined4 uVar8;
  ulong uVar9;
  bfy_buffer *pbVar10;
  ulong uVar11;
  bfy_page *pbVar12;
  long lVar13;
  ulong uVar14;
  size_t *psVar15;
  
  if (new_pages != (bfy_page *)0x0 && new_len != 0) {
    if (((new_len == 1) && (buf->pages == (bfy_page *)0x0)) && ((buf->page).data == (int8_t *)0x0))
    {
      (buf->page).unref_arg = new_pages->unref_arg;
      piVar3 = new_pages->data;
      sVar4 = new_pages->size;
      sVar5 = new_pages->read_pos;
      sVar6 = new_pages->write_pos;
      uVar8 = *(undefined4 *)&new_pages->field_0x24;
      pbVar7 = new_pages->unref_cb;
      (buf->page).flags = new_pages->flags;
      *(undefined4 *)&(buf->page).field_0x24 = uVar8;
      (buf->page).unref_cb = pbVar7;
      (buf->page).read_pos = sVar5;
      (buf->page).write_pos = sVar6;
      (buf->page).data = piVar3;
      (buf->page).size = sVar4;
      lVar13 = new_pages->write_pos - new_pages->read_pos;
    }
    else {
      ppbVar1 = &buf->pages;
      pbVar2 = (bfy_buffer *)buf->pages;
      pbVar10 = buf;
      pbVar12 = (bfy_page *)ppbVar1;
      if (pbVar2 != (bfy_buffer *)0x0) {
        pbVar12 = &pbVar2->page + buf->n_pages;
        pbVar10 = pbVar2;
      }
      uVar11 = ((long)pbVar12 - (long)pbVar10 >> 3) * 0x6db6db6db6db6db7 + new_len;
      if (buf->n_pages_alloc < uVar11) {
        uVar9 = 0x10;
        do {
          uVar14 = uVar9;
          uVar9 = uVar14 * 2;
        } while (uVar14 < uVar11);
        pbVar12 = (bfy_page *)(*allocator.realloc)(pbVar2,uVar14 * 0x38);
        if (pbVar12 != (bfy_page *)0x0) {
          buf->pages = pbVar12;
          buf->n_pages_alloc = uVar14;
        }
      }
      pbVar12 = *ppbVar1;
      if (pbVar12 == (bfy_page *)0x0) {
        return -1;
      }
      if ((buf->n_pages == 0) && ((buf->page).data != (int8_t *)0x0)) {
        buf->n_pages = 1;
        pbVar12->unref_arg = (buf->page).unref_arg;
        piVar3 = (buf->page).data;
        sVar4 = (buf->page).size;
        sVar5 = (buf->page).read_pos;
        sVar6 = (buf->page).write_pos;
        uVar8 = *(undefined4 *)&(buf->page).field_0x24;
        pbVar7 = (buf->page).unref_cb;
        pbVar12->flags = (buf->page).flags;
        *(undefined4 *)&pbVar12->field_0x24 = uVar8;
        pbVar12->unref_cb = pbVar7;
        pbVar12->read_pos = sVar5;
        pbVar12->write_pos = sVar6;
        pbVar12->data = piVar3;
        pbVar12->size = sVar4;
        (buf->page).data = (int8_t *)0x0;
        (buf->page).size = 0;
        (buf->page).read_pos = 0;
        (buf->page).write_pos = 0;
        *(undefined8 *)&(buf->page).flags = 0;
        (buf->page).unref_cb = (bfy_unref_cb *)0x0;
        (buf->page).unref_arg = (void *)0x0;
      }
      uVar11 = buf->n_pages;
      if (pos < uVar11) {
        memmove(*ppbVar1 + pos + new_len,*ppbVar1 + pos,(uVar11 - pos) * 0x38);
        uVar11 = pos;
      }
      memcpy(buf->pages + uVar11,new_pages,new_len * 0x38);
      buf->n_pages = buf->n_pages + new_len;
      if (new_len == 0) {
        lVar13 = 0;
      }
      else {
        psVar15 = &new_pages->write_pos;
        lVar13 = 0;
        do {
          lVar13 = (lVar13 + *psVar15) - psVar15[-1];
          psVar15 = psVar15 + 7;
          new_len = new_len - 1;
        } while (new_len != 0);
      }
    }
    buf->content_len = buf->content_len + lVar13;
    if (buf->changed_muted == 0) {
      psVar15 = &(buf->changed_info).n_added;
      *psVar15 = *psVar15 + lVar13;
      buffer_check_changed_cb(buf);
    }
  }
  return 0;
}

Assistant:

static int
buffer_insert_pages(bfy_buffer* buf, size_t pos,
                    struct bfy_page const* new_pages,
                    size_t new_len) {
    if (new_len == 0 || new_pages == NULL) {
        return 0;
    }

    // if we have nothing, use buf->page
    if (new_len == 1 && buf->pages == NULL && buf->page.data == NULL) {
        buf->page = *new_pages;
        buffer_record_content_added(buf, page_get_content_len(new_pages));
        return 0;
    }

    // ensure we have enough space in buf->pages
    size_t n_pages_alloc = buffer_count_pages(buf) + new_len;
    size_t const pagesize = sizeof(struct bfy_page);
    if (n_pages_alloc > buf->n_pages_alloc) {
        n_pages_alloc = pick_capacity(16, n_pages_alloc);
        void* pages = allocator.realloc(buf->pages, pagesize * n_pages_alloc);
        if (pages != NULL) {
            buf->pages = pages;
            buf->n_pages_alloc = n_pages_alloc;
        }
    }
    if (buf->pages == NULL) {
        return -1;
    }

    // if we had 1 page and are inserting more, handle the special case
    // of moving the single buf->page into the multipage array
    if (buf->n_pages == 0 && buf->page.data != NULL) {
        buf->n_pages = 1;
        *buf->pages = buf->page;
        buf->page = InitPage;
    }

    // insert new_pages into buf->pages
    pos = size_t_min(pos, buf->n_pages);
    if (buf->n_pages > pos) {
        memmove(buf->pages + pos + new_len, buf->pages + pos, pagesize * (buf->n_pages - pos));
    }
    memcpy(buf->pages + pos, new_pages, pagesize * new_len);
    buf->n_pages += new_len;

    // record the new content
    size_t new_content_len = 0;
    for (size_t i = 0; i < new_len; ++i) {
        new_content_len += page_get_content_len(new_pages + i);
    }
    buffer_record_content_added(buf, new_content_len);
    return 0;
}